

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

string * util::join(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *in,char delim)

{
  size_type sVar1;
  const_reference pvVar2;
  char in_DL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  size_t i;
  stringstream ss;
  ulong local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [383];
  char local_11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_10);
    if (sVar1 <= local_1a8) break;
    if (local_1a8 != 0) {
      std::operator<<(local_190,local_11);
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_10,local_1a8);
    std::operator<<(local_190,(string *)pvVar2);
    local_1a8 = local_1a8 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string join(const std::vector<std::string>& in, char delim) {
  std::stringstream ss;
  for (size_t i = 0; i < in.size(); i++) {
    if (i > 0) {
      ss << delim;
    }
    ss << in[i];
  }
  return ss.str();
}